

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

void __thiscall QDockAreaLayout::saveState(QDockAreaLayout *this,QDataStream *stream)

{
  bool bVar1;
  QDataStream *pQVar2;
  QDataStream *in_RSI;
  QRect *in_RDI;
  long in_FS_OFFSET;
  int i_2;
  int i_1;
  int i;
  int cnt;
  QDataStream *in_stack_00000080;
  QDockAreaLayoutInfo *in_stack_00000088;
  quint8 in_stack_ffffffffffffffaf;
  QDataStream *in_stack_ffffffffffffffb0;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  QSize local_18;
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QDataStream::operator<<(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffaf);
  local_2c = 0;
  for (local_30 = 0; local_30 < 4; local_30 = local_30 + 1) {
    bVar1 = QList<QDockAreaLayoutItem>::isEmpty((QList<QDockAreaLayoutItem> *)0x576cbe);
    if (!bVar1) {
      local_2c = local_2c + 1;
    }
  }
  QDataStream::operator<<(in_RSI,local_2c);
  for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
    bVar1 = QList<QDockAreaLayoutItem>::isEmpty((QList<QDockAreaLayoutItem> *)0x576d1b);
    if (!bVar1) {
      pQVar2 = (QDataStream *)QDataStream::operator<<(in_RSI,local_34);
      local_10 = QRect::size(in_RDI);
      ::operator<<(pQVar2,(QSize *)&local_10);
      QDockAreaLayoutInfo::saveState(in_stack_00000088,in_stack_00000080);
    }
  }
  pQVar2 = in_RSI;
  local_18 = QRect::size(in_RDI);
  ::operator<<(pQVar2,(QSize *)&local_18);
  for (local_38 = 0; local_38 < 4; local_38 = local_38 + 1) {
    QDataStream::operator<<(in_RSI,(&in_RDI->x1)[local_38].m_i);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDockAreaLayout::saveState(QDataStream &stream) const
{
    stream << (uchar) DockWidgetStateMarker;
    int cnt = 0;
    for (int i = 0; i < QInternal::DockCount; ++i) {
        if (!docks[i].item_list.isEmpty())
            ++cnt;
    }
    stream << cnt;
    for (int i = 0; i < QInternal::DockCount; ++i) {
        if (docks[i].item_list.isEmpty())
            continue;
        stream << i << docks[i].rect.size();
        docks[i].saveState(stream);
    }

    stream << centralWidgetRect.size();

    for (int i = 0; i < 4; ++i)
        stream << static_cast<int>(corners[i]);
}